

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QPainterClipInfo>::moveAppend
          (QGenericArrayOps<QPainterClipInfo> *this,QPainterClipInfo *b,QPainterClipInfo *e)

{
  QPainterClipInfo *this_00;
  ulong in_RDX;
  ulong in_RSI;
  QPainterClipInfo *in_RDI;
  QPainterClipInfo *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QPainterClipInfo>::begin
                        ((QArrayDataPointer<QPainterClipInfo> *)0x5b1a87);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QPainterClipInfo::QPainterClipInfo(this_00,in_RDI);
      local_10 = local_10 + 0xa0;
      (in_RDI->matrix).m_matrix[0][1] = (qreal)((long)(in_RDI->matrix).m_matrix[0][1] + 1);
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }